

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O0

Statement *
slang::ast::ExpressionStatement::fromSyntax
          (Compilation *compilation,ExpressionStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  string_view arg;
  bool bVar1;
  SubroutineKind SVar2;
  ExpressionSyntax *pEVar3;
  SourceLocation this;
  ExpressionStatement *pEVar4;
  AssignmentExpression *this_00;
  UnaryExpression *pUVar5;
  long in_RCX;
  CallExpression *this_01;
  sockaddr *in_RDX;
  SourceLocation in_RDI;
  UnaryExpression *unary;
  AssignmentExpression *ae;
  SubroutineKind subKind;
  bool ok;
  ExpressionStatement *result;
  Expression *expr;
  bitmask<slang::ast::ASTFlags> extraFlags;
  Compilation *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined3 uVar6;
  bitmask<slang::ast::CompilationFlags> in_stack_ffffffffffffff04;
  CallExpression *in_stack_ffffffffffffff08;
  SourceRange *in_stack_ffffffffffffff10;
  SourceLocation this_02;
  SourceLocation in_stack_ffffffffffffff28;
  DiagCode code;
  byte local_c1;
  Diagnostic *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  TimingControl *in_stack_ffffffffffffff78;
  StatementContext *in_stack_ffffffffffffff80;
  char local_69;
  bitmask<slang::ast::ASTFlags> local_40;
  bitmask<slang::ast::CompilationFlags> local_38;
  bitmask<slang::ast::StatementFlags> local_34;
  bitmask<slang::ast::ASTFlags> local_30;
  long local_28;
  sockaddr *local_20;
  SourceLocation local_10;
  ExpressionStatement *local_8;
  undefined4 extraout_var;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = in_RDI;
  local_30 = ast::operator|((ASTFlags)in_stack_ffffffffffffff08,
                            CONCAT44(in_stack_ffffffffffffff04.m_bits,in_stack_ffffffffffffff00));
  code = SUB84((ulong)(local_28 + 0x10) >> 0x20,0);
  bitmask<slang::ast::StatementFlags>::bitmask(&local_34,InForLoop);
  bVar1 = bitmask<slang::ast::StatementFlags>::has
                    ((bitmask<slang::ast::StatementFlags> *)
                     CONCAT44(in_stack_ffffffffffffff04.m_bits,in_stack_ffffffffffffff00),
                     (bitmask<slang::ast::StatementFlags> *)in_stack_fffffffffffffef8);
  local_c1 = 0;
  if (bVar1) {
    pEVar3 = not_null<slang::syntax::ExpressionSyntax_*>::operator->
                       ((not_null<slang::syntax::ExpressionSyntax_*> *)0x880303);
    bVar1 = slang::syntax::BinaryExpressionSyntax::isKind((pEVar3->super_SyntaxNode).kind);
    local_c1 = 0;
    if (bVar1) {
      in_stack_ffffffffffffff28 = local_10;
      bitmask<slang::ast::CompilationFlags>::bitmask(&local_38,StrictDriverChecking);
      bVar1 = Compilation::hasFlag(in_stack_fffffffffffffef8,in_stack_ffffffffffffff04);
      local_c1 = bVar1 ^ 0xff;
    }
  }
  if ((local_c1 & 1) != 0) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_40,NotADriver);
    bitmask<slang::ast::ASTFlags>::operator|=(&local_30,&local_40);
  }
  pEVar3 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                     ((not_null<slang::syntax::ExpressionSyntax_*> *)0x880396);
  this._0_4_ = Expression::bind((int)pEVar3,local_20,(socklen_t)local_30.m_bits);
  this._4_4_ = extraout_var;
  this_02 = this;
  slang::syntax::SyntaxNode::sourceRange
            ((SyntaxNode *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  pEVar4 = BumpAllocator::
           emplace<slang::ast::ExpressionStatement,slang::ast::Expression_const&,slang::SourceRange>
                     ((BumpAllocator *)this_02,(Expression *)local_10,in_stack_ffffffffffffff10);
  bVar1 = Expression::bad((Expression *)
                          CONCAT44(in_stack_ffffffffffffff04.m_bits,in_stack_ffffffffffffff00));
  if (bVar1) {
    local_8 = (ExpressionStatement *)
              Statement::badStmt((Compilation *)
                                 CONCAT44(in_stack_ffffffffffffff04.m_bits,in_stack_ffffffffffffff00
                                         ),(Statement *)in_stack_fffffffffffffef8);
  }
  else {
    this_01 = (CallExpression *)(ulong)(*(int *)this - 10);
    switch(this_01) {
    case (CallExpression *)0x0:
      pUVar5 = Expression::as<slang::ast::UnaryExpression>((Expression *)this);
      uVar6 = (undefined3)in_stack_ffffffffffffff04.m_bits;
      in_stack_ffffffffffffff04.m_bits = CONCAT13(1,uVar6);
      if (((pUVar5->op != Preincrement) &&
          (in_stack_ffffffffffffff04.m_bits = CONCAT13(1,uVar6), pUVar5->op != Predecrement)) &&
         (in_stack_ffffffffffffff04.m_bits = CONCAT13(1,uVar6), pUVar5->op != Postincrement)) {
        in_stack_ffffffffffffff04.m_bits = CONCAT13(pUVar5->op == Postdecrement,uVar6);
      }
      local_69 = (char)(in_stack_ffffffffffffff04.m_bits >> 0x18);
      break;
    default:
      local_69 = '\0';
      break;
    case (CallExpression *)0x4:
      this_00 = Expression::as<slang::ast::AssignmentExpression>((Expression *)this);
      bVar1 = AssignmentExpression::isBlocking(this_00);
      if ((bVar1) && (this_00->timingControl != (TimingControl *)0x0)) {
        Statement::StatementContext::observeTiming
                  (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
      local_69 = '\x01';
      break;
    case (CallExpression *)0xb:
      Expression::as<slang::ast::CallExpression>((Expression *)this);
      SVar2 = CallExpression::getSubroutineKind(in_stack_ffffffffffffff08);
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x8804b0)
      ;
      bVar1 = Type::isVoid((Type *)0x8804b8);
      if ((!bVar1) && (SVar2 == Function)) {
        sourceRange.endLoc = in_stack_ffffffffffffff28;
        sourceRange.startLoc = this_02;
        ASTContext::addDiag((ASTContext *)local_10,code,sourceRange);
        Expression::as<slang::ast::CallExpression>((Expression *)this);
        CallExpression::getSubroutineName(this_01);
        arg._M_str._0_4_ = in_stack_ffffffffffffff50;
        arg._M_len = in_stack_ffffffffffffff48;
        arg._M_str._4_4_ = in_stack_ffffffffffffff54;
        Diagnostic::operator<<(in_stack_ffffffffffffff40,arg);
      }
      local_69 = '\x01';
      break;
    case (CallExpression *)0x18:
      local_69 = '\x01';
    }
    local_8 = pEVar4;
    if (local_69 == '\0') {
      sourceRange_00.endLoc = in_stack_ffffffffffffff28;
      sourceRange_00.startLoc = this_02;
      ASTContext::addDiag((ASTContext *)local_10,code,sourceRange_00);
      local_8 = (ExpressionStatement *)
                Statement::badStmt((Compilation *)
                                   CONCAT44(in_stack_ffffffffffffff04.m_bits,
                                            in_stack_ffffffffffffff00),
                                   (Statement *)in_stack_fffffffffffffef8);
    }
  }
  return &local_8->super_Statement;
}

Assistant:

Statement& ExpressionStatement::fromSyntax(Compilation& compilation,
                                           const ExpressionStatementSyntax& syntax,
                                           const ASTContext& context, StatementContext& stmtCtx) {
    bitmask<ASTFlags> extraFlags = ASTFlags::AssignmentAllowed | ASTFlags::TopLevelStatement;
    if (stmtCtx.flags.has(StatementFlags::InForLoop) &&
        BinaryExpressionSyntax::isKind(syntax.expr->kind) &&
        !compilation.hasFlag(CompilationFlags::StrictDriverChecking)) {
        extraFlags |= ASTFlags::NotADriver;
    }

    auto& expr = Expression::bind(*syntax.expr, context, extraFlags);
    auto result = compilation.emplace<ExpressionStatement>(expr, syntax.sourceRange());
    if (expr.bad())
        return badStmt(compilation, result);

    // Only a subset of expressions are allowed as statements.
    bool ok;
    switch (expr.kind) {
        case ExpressionKind::Call: {
            auto subKind = expr.as<CallExpression>().getSubroutineKind();
            if (!expr.type->isVoid() && subKind == SubroutineKind::Function) {
                context.addDiag(diag::UnusedResult, expr.sourceRange)
                    << expr.as<CallExpression>().getSubroutineName();
            }
            ok = true;
            break;
        }
        case ExpressionKind::Assignment: {
            const AssignmentExpression& ae = expr.as<AssignmentExpression>();
            if (ae.isBlocking() && ae.timingControl)
                stmtCtx.observeTiming(*ae.timingControl);

            ok = true;
            break;
        }
        case ExpressionKind::NewClass:
            ok = true;
            break;
        case ExpressionKind::UnaryOp: {
            auto& unary = expr.as<UnaryExpression>();
            ok = unary.op == UnaryOperator::Preincrement ||
                 unary.op == UnaryOperator::Predecrement ||
                 unary.op == UnaryOperator::Postincrement ||
                 unary.op == UnaryOperator::Postdecrement;
            break;
        }
        default:
            ok = false;
            break;
    }

    if (!ok) {
        context.addDiag(diag::ExprNotStatement, expr.sourceRange);
        return badStmt(compilation, result);
    }

    return *result;
}